

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_unix.cpp
# Opt level: O2

void __thiscall QThreadPrivate::finish(QThreadPrivate *this)

{
  QMutex *this_00;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_setcancelstate(1,(int *)0x0);
  this_00 = &this->mutex;
  local_30.m_isLocked = false;
  local_30._9_7_ = 0xaaaaaaaaaaaaaa;
  local_30.m_mutex = this_00;
  QBasicMutex::lock(&this_00->super_QBasicMutex);
  this->threadState = Finishing;
  QBasicMutex::unlock(&this_00->super_QBasicMutex);
  QThread::finished();
  QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
  QThreadStoragePrivate::finish(&this->data->tls);
  QMutexLocker<QMutex>::~QMutexLocker(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPrivate::finish()
{
    terminate_on_exception([&] {
        QThreadPrivate *d = this;
        QThread *thr = q_func();

        // Disable cancellation; we're already in the finishing touches of this
        // thread, and we don't want cleanup to be disturbed by
        // abi::__forced_unwind being thrown from all kinds of functions.
#ifdef PTHREAD_CANCEL_DISABLE
        pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, nullptr);
#endif

        QMutexLocker locker(&d->mutex);

        d->threadState = QThreadPrivate::Finishing;
        locker.unlock();
        emit thr->finished(QThread::QPrivateSignal());
        QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);

        QThreadStoragePrivate::finish(&d->data->tls);
    });

    if constexpr (QT_CONFIG(broken_threadlocal_dtors))
        cleanup();
}